

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O3

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::GetTexLockOffset
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  GMM_RESOURCE_TYPE GVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  uint8_t uVar5;
  anon_union_8_2_48ff183f_for_anon_struct_16_3_bc420dd9_for_Lock_0 aVar6;
  undefined4 extraout_var_00;
  anon_union_8_2_48ff183f_for_anon_struct_16_3_bc420dd9_for_Lock_0 aVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint local_4c;
  ulong uStack_48;
  uint32_t MipHeight;
  uint local_40;
  uint32_t local_3c;
  uint32_t MipWidth;
  undefined4 extraout_var;
  
  if (pReqInfo == (GMM_REQ_OFFSET_INFO *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  _MipWidth = GmmGetPlatformInfo(this->pGmmLibContext);
  uVar9 = pTexInfo->Pitch;
  uStack_48 = (ulong)pReqInfo->MipLevel;
  uVar11 = pReqInfo->Slice;
  uVar5 = GmmIsPlanar(pTexInfo->Format);
  uVar4 = uStack_48;
  uVar10 = (uint)uVar9;
  if (uVar5 == '\0') {
    GVar1 = pTexInfo->Type;
    local_3c = uVar11;
    if ((GVar1 - RESOURCE_1D < 2) || (GVar1 == RESOURCE_CUBE)) {
      aVar7._0_4_ = (*this->_vptr_GmmTextureCalc[0x10])(this,pTexInfo,pReqInfo);
      aVar7.Offset64._4_4_ = extraout_var_00;
    }
    else if (GVar1 == RESOURCE_3D) {
      if ((int)(_MipWidth->Platform).eRenderCoreFamily < 0xc) {
        bVar3 = (byte)uStack_48;
        local_4c = pTexInfo->BaseHeight >> (bVar3 & 0x1f);
        local_40 = (uint)pTexInfo->BaseWidth >> (bVar3 & 0x1f);
        _MipWidth = (GMM_PLATFORM_INFO *)(uVar9 & 0xffffffff);
        AlignTexHeightWidth(this,pTexInfo,&local_4c,&local_40);
        uVar9 = 1L << (bVar3 & 0x3f);
        lVar2 = *(long *)(pTexInfo->MmcHint + uVar4 * 8 + 0x78);
        (pReqInfo->Lock).field_2 =
             *(anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3 *)
              &(pTexInfo->OffsetInfo).field_0;
        aVar7.Offset64 =
             (ulong)local_4c * (long)_MipWidth * ((ulong)local_3c / (uVar9 & 0xffffffff)) + lVar2;
        uVar8 = (int)uVar9 - 1U & local_3c;
        if (uVar8 != 0) {
          aVar7.Offset64 =
               aVar7.Offset64 +
               ((ulong)pTexInfo->BitsPerPixel * (ulong)local_40 * (ulong)uVar8 >> 3);
        }
      }
      else {
        aVar7._0_4_ = (*this->_vptr_GmmTextureCalc[0x10])(this,pTexInfo,pReqInfo);
        aVar7.Offset64._4_4_ = 0;
        (pReqInfo->Lock).field_2 =
             *(anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3 *)
              &(pTexInfo->OffsetInfo).field_0;
      }
    }
    else {
      aVar7.Offset64 = 0;
    }
    (pReqInfo->Lock).field_0 = aVar7;
    (pReqInfo->Lock).Pitch = uVar10;
  }
  else {
    aVar6._0_4_ = (*this->_vptr_GmmTextureCalc[0x10])(this,pTexInfo,pReqInfo);
    aVar6.Offset64._4_4_ = extraout_var;
    (pReqInfo->Lock).field_0 = aVar6;
    (pReqInfo->Lock).Pitch = uVar10;
    if (((pReqInfo->Plane & ~GMM_PLANE_3D_Y1) == GMM_PLANE_3D_UV0) &&
       (uVar8 = pTexInfo->Format - GMM_FORMAT_I420, uVar8 < 0x27)) {
      if ((0x2000002003U >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
        if ((ulong)uVar8 != 0x26) {
          return GMM_SUCCESS;
        }
        uVar11 = uVar10 >> 2;
      }
      else {
        uVar11 = (uint)(uVar9 >> 1) & 0x7fffffff;
      }
      (pReqInfo->Lock).Pitch = uVar11;
    }
  }
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::GetTexLockOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                                    GMM_REQ_OFFSET_INFO *pReqInfo)
{
    GMM_STATUS     Result = GMM_SUCCESS;
    GMM_GFX_SIZE_T AddressOffset;
    uint32_t       Pitch, Slice;
    uint32_t       MipHeight, MipWidth, MipLevel;
    uint32_t       NumberOfMipsInSingleRow, SliceRow;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pReqInfo, GMM_ERROR);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    // set default value
    AddressOffset = 0;
    Pitch         = GFX_ULONG_CAST(pTexInfo->Pitch);
    MipLevel      = pReqInfo->MipLevel;
    Slice         = pReqInfo->Slice;

    if(GmmIsPlanar(pTexInfo->Format))
    {
        AddressOffset           = GetMipMapByteAddress(pTexInfo, pReqInfo);
        pReqInfo->Lock.Offset64 = AddressOffset;
        pReqInfo->Lock.Pitch    = Pitch;

        // Adjust returned pitch for non-uniform-pitch U/V queries...
        if((pReqInfo->Plane == GMM_PLANE_U) ||
           (pReqInfo->Plane == GMM_PLANE_V))
        {
            switch(pTexInfo->Format)
            {
                case GMM_FORMAT_I420:
                case GMM_FORMAT_IYUV:
                case GMM_FORMAT_YV12:
                case GMM_FORMAT_NV11:
                    pReqInfo->Lock.Pitch /= 2;
                    break;
                case GMM_FORMAT_YVU9:
                    pReqInfo->Lock.Pitch /= 4;
                    break;
                default:
                    //Cool--Constant pitch across all planes.
                    break;
            }
        }

        return Result;
    }

    switch(pTexInfo->Type)
    {
        case RESOURCE_3D:
        {
            if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE)
            {
                AddressOffset = GFX_ULONG_CAST(GetMipMapByteAddress(pTexInfo, pReqInfo));

                // Bytes from one slice to the next...
                pReqInfo->Lock.Gen9PlusSlicePitch = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock);
            }
            else
            {
                MipHeight = pTexInfo->BaseHeight >> MipLevel;
                MipWidth  = GFX_ULONG_CAST(pTexInfo->BaseWidth) >> MipLevel;

                AlignTexHeightWidth(pTexInfo, &MipHeight, &MipWidth);

                // See how many mip can fit in one row
                NumberOfMipsInSingleRow = GFX_2_TO_POWER_OF(MipLevel);

                SliceRow = Slice / NumberOfMipsInSingleRow;

                // get the base address + Slice pitch
                AddressOffset = pTexInfo->OffsetInfo.Texture3DOffsetInfo.Offset[MipLevel];

                pReqInfo->Lock.Mip0SlicePitch = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Texture3DOffsetInfo.Mip0SlicePitch);

                // Actual address is offset based on requested slice
                AddressOffset += (GMM_GFX_SIZE_T)SliceRow * MipHeight * Pitch;

                // Get to particular slice
                if(Slice % NumberOfMipsInSingleRow)
                {
                    AddressOffset += (((GMM_GFX_SIZE_T)(Slice % NumberOfMipsInSingleRow) *
                                       MipWidth * pTexInfo->BitsPerPixel) >>
                                      3);
                }
            }
            break;
        }
        case RESOURCE_CUBE:
        case RESOURCE_2D:
        case RESOURCE_1D:
        {
            AddressOffset = GetMipMapByteAddress(pTexInfo, pReqInfo);
            break;
        }
        default:
        { // These resources dont' have multiple levels of detail
            AddressOffset = 0;
            break;
        }
    }

    pReqInfo->Lock.Offset64 = AddressOffset;
    pReqInfo->Lock.Pitch    = Pitch;

    return Result;
}